

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

uint64_t VP8LHistogramEstimateBits(VP8LHistogram *p)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long *in_RDI;
  uint32_t *unaff_retaddr;
  int in_stack_0000000c;
  uint32_t *in_stack_00000010;
  
  VP8LHistogramNumCodes((int)in_RDI[0x195]);
  uVar3 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  uVar4 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  uVar5 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  uVar6 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  uVar7 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  uVar1 = (*VP8LExtraCost)((uint32_t *)(*in_RDI + 0x400),0x18);
  uVar2 = (*VP8LExtraCost)((uint32_t *)(in_RDI + 0x181),0x28);
  return uVar3 + uVar4 + uVar5 + uVar6 + uVar7 + (ulong)(uVar1 + uVar2) * 0x800000;
}

Assistant:

uint64_t VP8LHistogramEstimateBits(VP8LHistogram* const p) {
  return PopulationCost(p->literal_,
                        VP8LHistogramNumCodes(p->palette_code_bits_), NULL,
                        &p->is_used_[0]) +
         PopulationCost(p->red_, NUM_LITERAL_CODES, NULL, &p->is_used_[1]) +
         PopulationCost(p->blue_, NUM_LITERAL_CODES, NULL, &p->is_used_[2]) +
         PopulationCost(p->alpha_, NUM_LITERAL_CODES, NULL, &p->is_used_[3]) +
         PopulationCost(p->distance_, NUM_DISTANCE_CODES, NULL,
                        &p->is_used_[4]) +
         ((uint64_t)(VP8LExtraCost(p->literal_ + NUM_LITERAL_CODES,
                                   NUM_LENGTH_CODES) +
                     VP8LExtraCost(p->distance_, NUM_DISTANCE_CODES))
          << LOG_2_PRECISION_BITS);
}